

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sn76489.c
# Opt level: O2

void SN76489_Reset(SN76489_Context *chip)

{
  long lVar1;
  
  chip->PSGStereo = 0xff;
  for (lVar1 = -0x10; lVar1 != 0; lVar1 = lVar1 + 4) {
    *(undefined4 *)((long)chip->ToneFreqVals + lVar1 + -10) = 0xf0001;
    chip->NoiseFreq = 0x10;
    *(undefined4 *)((long)chip->ToneFreqPos + lVar1) = 0;
    *(undefined4 *)((long)chip->IntermediatePos + lVar1) = 1;
    *(undefined4 *)((long)chip->ChannelState + lVar1) = 0x800000;
  }
  chip->LatchedRegister = '\0';
  chip->NoiseShiftRegister = 0x8000;
  chip->Clock = 0.0;
  return;
}

Assistant:

static void SN76489_Reset(SN76489_Context* chip)
{
	int i;

	chip->PSGStereo = 0xFF;

	for( i = 0; i <= 3; i++ )
	{
		/* Initialise PSG state */
		chip->Registers[2*i] = 1;		 /* tone freq=1 */
		chip->Registers[2*i+1] = 0xf;	 /* vol=off */
		chip->NoiseFreq = 0x10;

		/* Set counters to 0 */
		chip->ToneFreqVals[i] = 0;

		/* Set flip-flops to 1 */
		chip->ToneFreqPos[i] = 1;

		/* Set intermediate positions to do-not-use value */
		chip->IntermediatePos[i] = FLT_MIN;

		/* Set panning to centre */
		//Panning_Centre( chip->panning[i] );
	}

	chip->LatchedRegister = 0;

	/* Initialise noise generator */
	chip->NoiseShiftRegister = NoiseInitialState;

	/* Zero clock */
	chip->Clock = 0;
}